

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printPCRelOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  int iVar3;
  MCOperand *op;
  ulong uVar4;
  uint8_t *puVar5;
  int32_t imm;
  MCOperand *MO;
  SStream *O_local;
  int OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  _Var2 = MCOperand_isImm(op);
  if (_Var2) {
    uVar4 = MCOperand_getImm(op);
    iVar3 = (int)uVar4;
    if (iVar3 < 0) {
      if (iVar3 < -9) {
        SStream_concat(O,"-0x%x",(ulong)(uint)-iVar3);
      }
      else {
        SStream_concat(O,"-%u",(ulong)(uint)-iVar3);
      }
    }
    else if (iVar3 < 10) {
      SStream_concat(O,"%u",uVar4 & 0xffffffff);
    }
    else {
      SStream_concat(O,"0x%x",uVar4 & 0xffffffff);
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar5 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x16;
      puVar5[0] = '\x02';
      puVar5[1] = '\0';
      puVar5[2] = '\0';
      puVar5[3] = '\0';
      *(long *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1e) = (long)iVar3;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
    }
  }
  return;
}

Assistant:

static void printPCRelOperand(MCInst *MI, int OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	int32_t imm;

	if (MCOperand_isImm(MO)) {
		imm = (int32_t)MCOperand_getImm(MO);
		if (imm >= 0) {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", imm);
			else
				SStream_concat(O, "%u", imm);
		} else {
			if (imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -imm);
			else
				SStream_concat(O, "-%u", -imm);
		}

		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)imm;
			MI->flat_insn->detail->sysz.op_count++;
		}
	}
}